

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkRenderPassCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRenderPassCreateInfo>
          (Impl *this,VkRenderPassCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkRenderPassCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkRenderPassCreateInfo>(alloc,count);
    if (pVVar1 != (VkRenderPassCreateInfo *)0x0) {
      pVVar1 = (VkRenderPassCreateInfo *)memmove(pVVar1,src,count << 6);
      return pVVar1;
    }
  }
  return (VkRenderPassCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}